

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

ULONG __thiscall Js::FunctionBody::GetSourceLineNumber(FunctionBody *this,uint statementIndex)

{
  uint in_EAX;
  uint startCharOfStatement;
  ULONG UVar1;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  UVar1 = 0;
  if (statementIndex != 0xffffffff) {
    startCharOfStatement = GetStartOffset(this,statementIndex);
    UVar1 = 0;
    if (statementIndex == 0 || startCharOfStatement != 0) {
      GetLineCharOffsetFromStartChar
                (this,startCharOfStatement,(ULONG *)((long)&uStack_28 + 4),(LONG *)0x0,false);
      UVar1 = uStack_28._4_4_ + 1;
    }
  }
  return UVar1;
}

Assistant:

ULONG FunctionBody::GetSourceLineNumber(uint statementIndex)
    {
        ULONG line = 0;
        if (statementIndex != Js::Constants::NoStatementIndex)
        {
            uint startOffset = GetStartOffset(statementIndex);

            if (startOffset != 0 || statementIndex == 0)
            {
                GetLineCharOffsetFromStartChar(startOffset, &line, nullptr, false /*canAllocateLineCache*/);
                line = line + 1;
            }
        }

        return line;
    }